

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O2

int rndmonnum(level *lev)

{
  ushort uVar1;
  boolean bVar2;
  int iVar3;
  uint uVar4;
  permonst *ptr;
  
  ptr = rndmonst(lev);
  if (ptr != (permonst *)0x0) {
    iVar3 = monsndx(ptr);
    return iVar3;
  }
  do {
    do {
      uVar4 = mt_random();
      uVar1 = *(ushort *)((long)mons[0].mattk + ((ulong)(uVar4 % 0x158 << 6) - 2));
    } while ((uVar1 >> 9 & 1) != 0);
    bVar2 = In_hell(&lev->z);
  } while (((uVar1 >> 10 & 1) != 0) && (bVar2 == '\0'));
  return uVar4 % 0x158;
}

Assistant:

int rndmonnum(struct level *lev)
{
	const struct permonst *ptr;
	int i;

	/* Plan A: get a level-appropriate common monster */
	ptr = rndmonst(lev);
	if (ptr) return monsndx(ptr);

	/* Plan B: get any common monster */
	do {
	    i = rn1(SPECIAL_PM - LOW_PM, LOW_PM);
	    ptr = &mons[i];
	} while ((ptr->geno & G_NOGEN) || (!In_hell(&lev->z) && (ptr->geno & G_HELL)));

	return i;
}